

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::android::testMandatoryExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *log;
  bool bVar3;
  qpTestResult qVar4;
  long *plVar5;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  size_type *psVar6;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> extensions;
  ResultCollector results;
  string local_138;
  RequiredExtension local_118;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_d8;
  ResultCollector local_c0;
  Maybe<unsigned_int> local_70;
  Maybe<unsigned_int> local_60;
  Maybe<unsigned_int> local_50;
  Maybe<unsigned_int> local_40;
  
  log = context->m_testCtx->m_log;
  paVar1 = &local_118.name.field_2;
  local_118.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  tcu::ResultCollector::ResultCollector(&local_c0,log,&local_118.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  ::vk::enumerateInstanceExtensionProperties(&local_d8,context->m_platformInterface,(char *)0x0);
  paVar2 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"VK_KHR_get_physical_device_properties2","");
  local_40.m_ptr = (uint *)0x0;
  local_50.m_ptr = (uint *)0x0;
  ::vk::RequiredExtension::RequiredExtension(&local_118,&local_138,&local_40,&local_50);
  bVar3 = ::vk::isExtensionSupported(&local_d8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    local_138._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"VK_KHR_get_physical_device_properties2","");
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_118.name.field_2._M_allocated_capacity = *psVar6;
      local_118.name.field_2._8_8_ = plVar5[3];
      local_118.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118.name.field_2._M_allocated_capacity = *psVar6;
      local_118.name._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118.name._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(&local_c0,&local_118.name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.name._M_dataplus._M_p,
                      local_118.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_d8.
      super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  vki = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties(&local_d8,vki,physicalDevice,(char *)0x0);
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"VK_KHR_maintenance1","");
  local_60.m_ptr = (uint *)0x0;
  local_70.m_ptr = (uint *)0x0;
  ::vk::RequiredExtension::RequiredExtension(&local_118,&local_138,&local_60,&local_70);
  bVar3 = ::vk::isExtensionSupported(&local_d8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    local_138._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"VK_KHR_maintenance1","");
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_118.name.field_2._M_allocated_capacity = *psVar6;
      local_118.name.field_2._8_8_ = plVar5[3];
      local_118.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118.name.field_2._M_allocated_capacity = *psVar6;
      local_118.name._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118.name._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(&local_c0,&local_118.name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.name._M_dataplus._M_p,
                      local_118.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_d8.
      super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  qVar4 = tcu::ResultCollector::getResult(&local_c0);
  local_118.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_c0.m_message._M_dataplus._M_p,
             local_c0.m_message._M_dataplus._M_p + local_c0.m_message._M_string_length);
  __return_storage_ptr__->m_code = qVar4;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_118.name._M_dataplus._M_p,
             local_118.name._M_dataplus._M_p + local_118.name._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.name._M_dataplus._M_p,local_118.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_message._M_dataplus._M_p != &local_c0.m_message.field_2) {
    operator_delete(local_c0.m_message._M_dataplus._M_p,
                    local_c0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_prefix._M_dataplus._M_p != &local_c0.m_prefix.field_2) {
    operator_delete(local_c0.m_prefix._M_dataplus._M_p,
                    local_c0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testMandatoryExtensions (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	// Instance extensions
	{
		static const char*					mandatoryExtensions[]	=
		{
			"VK_KHR_get_physical_device_properties2",
		};
		const vector<VkExtensionProperties>	extensions				= enumerateInstanceExtensionProperties(context.getPlatformInterface(), DE_NULL);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(mandatoryExtensions); ++ndx)
		{
			if (!isExtensionSupported(extensions, RequiredExtension(mandatoryExtensions[ndx])))
				results.fail(string(mandatoryExtensions[ndx]) + " is not supported");
		}
	}

	// Device extensions
	{
		static const char*					mandatoryExtensions[]	=
		{
			"VK_KHR_maintenance1",
		};
		const vector<VkExtensionProperties>	extensions				= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(mandatoryExtensions); ++ndx)
		{
			if (!isExtensionSupported(extensions, RequiredExtension(mandatoryExtensions[ndx])))
				results.fail(string(mandatoryExtensions[ndx]) + " is not supported");
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}